

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStackSwitch(BinaryInstWriter *this,StackSwitch *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *this_01;
  bool bVar1;
  uint32_t value;
  U32LEB local_24;
  uintptr_t local_20;
  StackSwitch *local_18;
  StackSwitch *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StackSwitch *)this;
  bVar1 = wasm::Type::isContinuation(&curr->cont->type);
  if (!bVar1) {
    __assert_fail("curr->cont->type.isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0xaa9,"void wasm::BinaryInstWriter::visitStackSwitch(StackSwitch *)");
  }
  BufferWithRandomAccess::operator<<(this->o,-0x1b);
  this_00 = this->parent;
  local_20 = (uintptr_t)wasm::Type::getHeapType(&local_18->cont->type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,(HeapType)local_20);
  this_01 = this->o;
  value = WasmBinaryWriter::getTagIndex(this->parent,(Name)(local_18->tag).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_24,value);
  BufferWithRandomAccess::operator<<(this_01,local_24);
  return;
}

Assistant:

void BinaryInstWriter::visitStackSwitch(StackSwitch* curr) {
  assert(curr->cont->type.isContinuation());
  o << int8_t(BinaryConsts::Switch);
  parent.writeIndexedHeapType(curr->cont->type.getHeapType());
  o << U32LEB(parent.getTagIndex(curr->tag));
}